

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void * __thiscall pbrt::ScratchBuffer::Alloc(ScratchBuffer *this,size_t size,size_t align)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int vb;
  size_t va;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = align;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->offset;
  if (SUB168(auVar3 % auVar2,0) != 0) {
    this->offset = ((int)align - SUB164(auVar3 % auVar2,0)) + this->offset;
  }
  iVar1 = this->offset;
  va = (long)iVar1 + size;
  vb = this->allocatedBytes;
  if (va <= (ulong)(long)vb) {
    this->offset = (int)size + iVar1;
    return this->ptr + iVar1;
  }
  LogFatal<char_const(&)[14],char_const(&)[15],char_const(&)[14],unsigned_long&,char_const(&)[15],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/memory.h"
             ,0xa4,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [14])"offset + size",
             (char (*) [15])"allocatedBytes",(char (*) [14])"offset + size",&va,
             (char (*) [15])"allocatedBytes",&vb);
}

Assistant:

PBRT_CPU_GPU
    void *Alloc(size_t size, size_t align) {
        if ((offset % align) != 0)
            offset += align - (offset % align);
        CHECK_LE(offset + size, allocatedBytes);

        void *p = ptr + offset;
        offset += size;
        return p;
    }